

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall S2Builder::AddExtraSites(S2Builder *this,MutableS2ShapeIndex *input_edge_index)

{
  InputEdgeId e;
  S1ChordAngle SVar1;
  vector<int,_std::allocator<int>_> snap_queue;
  vector<int,_std::allocator<int>_> chain;
  int local_6c;
  _Vector_base<int,_std::allocator<int>_> local_68;
  double local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_50 = (this->site_snap_radius_ca_).length2_;
  SVar1 = S1ChordAngle::Zero();
  if ((local_50 != SVar1.length2_) || (NAN(local_50) || NAN(SVar1.length2_))) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (local_6c = 0;
        (ulong)(long)local_6c <
        (ulong)((long)(this->input_edges_).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->input_edges_).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3); local_6c = local_6c + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_68,&local_6c);
      while (local_68._M_impl.super__Vector_impl_data._M_start !=
             local_68._M_impl.super__Vector_impl_data._M_finish) {
        e = local_68._M_impl.super__Vector_impl_data._M_finish[-1];
        local_68._M_impl.super__Vector_impl_data._M_finish =
             local_68._M_impl.super__Vector_impl_data._M_finish + -1;
        SnapEdge(this,e,(vector<int,_std::allocator<int>_> *)&local_48);
        MaybeAddExtraSites(this,e,local_6c,(vector<int,_std::allocator<int>_> *)&local_48,
                           input_edge_index,(vector<int,_std::allocator<int>_> *)&local_68);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void S2Builder::AddExtraSites(const MutableS2ShapeIndex& input_edge_index) {
  // When options_.split_crossing_edges() is true, this function may be called
  // even when site_snap_radius_ca_ == 0 (because edge_snap_radius_ca_ > 0).
  // However neither of the conditions above apply in that case.
  if (site_snap_radius_ca_ == S1ChordAngle::Zero()) return;

  vector<SiteId> chain;  // Temporary
  vector<InputEdgeId> snap_queue;
  for (InputEdgeId max_e = 0; max_e < input_edges_.size(); ++max_e) {
    snap_queue.push_back(max_e);
    while (!snap_queue.empty()) {
      InputEdgeId e = snap_queue.back();
      snap_queue.pop_back();
      SnapEdge(e, &chain);
      // We could save the snapped chain here in a snapped_chains_ vector, to
      // avoid resnapping it in AddSnappedEdges() below, however currently
      // SnapEdge only accounts for less than 5% of the runtime.
      MaybeAddExtraSites(e, max_e, chain, input_edge_index, &snap_queue);
    }
  }
}